

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QStringList * __thiscall
QString::split(QStringList *__return_storage_ptr__,QString *this,QRegularExpression *re,
              SplitBehavior behavior)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  long size;
  long in_FS_OFFSET;
  QRegularExpressionMatch match;
  QRegularExpressionMatchIterator iterator;
  QRegularExpressionMatch local_60;
  QRegularExpression local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  bVar1 = QRegularExpression::isValid(re);
  if (bVar1) {
    local_58.d.d.ptr =
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QRegularExpression::globalMatch
              (&local_58,(QString *)re,(qsizetype)this,NormalMatch,(MatchOptions)0x0);
    qVar3 = 0;
    while( true ) {
      bVar1 = QRegularExpressionMatchIterator::hasNext((QRegularExpressionMatchIterator *)&local_58)
      ;
      if (!bVar1) break;
      local_60.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QRegularExpressionMatchIterator::next((QRegularExpressionMatchIterator *)&local_60);
      qVar2 = QRegularExpressionMatch::capturedStart(&local_60,0);
      if (qVar2 - qVar3 != 0 ||
          (QFlagsStorage<Qt::SplitBehaviorFlags>)
          behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
          super_QFlagsStorage<Qt::SplitBehaviorFlags>.i ==
          (QFlagsStorage<Qt::SplitBehaviorFlags>)0x0) {
        QString(&local_50,(QChar *)((this->d).ptr + qVar3),qVar2 - qVar3);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_50);
        QList<QString>::end(__return_storage_ptr__);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      qVar3 = QRegularExpressionMatch::capturedEnd(&local_60,0);
      QRegularExpressionMatch::~QRegularExpressionMatch(&local_60);
    }
    size = (this->d).size - qVar3;
    if (size != 0 ||
        (QFlagsStorage<Qt::SplitBehaviorFlags>)
        behavior.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
        super_QFlagsStorage<Qt::SplitBehaviorFlags>.i == (QFlagsStorage<Qt::SplitBehaviorFlags>)0x0)
    {
      QString(&local_50,(QChar *)((this->d).ptr + qVar3),size);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_50);
      QList<QString>::end(__return_storage_ptr__);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QRegularExpressionMatchIterator::~QRegularExpressionMatchIterator
              ((QRegularExpressionMatchIterator *)&local_58);
  }
  else {
    QRegularExpression::pattern(&local_50,re);
    qtWarnAboutInvalidRegularExpression(&local_50,"QString::split");
    split();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QString::split(const QRegularExpression &re, Qt::SplitBehavior behavior) const
{
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0)
    const auto matchingFunction = qOverload<const QString &, qsizetype, QRegularExpression::MatchType, QRegularExpression::MatchOptions>(&QRegularExpression::globalMatch);
#else
    const auto matchingFunction = &QRegularExpression::globalMatch;
#endif
    return splitString<QStringList>(*this,
                                    re,
                                    matchingFunction,
                                    behavior);
}